

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles31::Functional::anon_unknown_1::genSetNthBitSampleMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,int nthBit)

{
  pointer puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_19;
  
  uVar2 = (long)nthBit / 0x20;
  iVar3 = (int)uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)(iVar3 + 1),&local_19);
  puVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < iVar3) {
    uVar5 = uVar2 & 0xffffffff;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    puVar1[uVar4] = 0;
  }
  puVar1[iVar3] = (uint)(1L << ((char)nthBit + (char)uVar2 * -0x20 & 0x3fU));
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> genSetNthBitSampleMask (int nthBit)
{
	const int				wordSize	= 32;
	const int				numWords	= getEffectiveSampleMaskWordCount(nthBit);
	const deUint32			topWordBits	= (deUint32)(nthBit - (numWords - 1) * wordSize);
	std::vector<deUint32>	mask		(numWords);

	for (int ndx = 0; ndx < numWords - 1; ++ndx)
		mask[ndx] = 0;

	mask[numWords - 1] = (deUint32)(1ULL << topWordBits);
	return mask;
}